

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

IRType Lowerer::GetArrayIndirType(ValueType valueType)

{
  code *pcVar1;
  bool bVar2;
  ObjectType OVar3;
  undefined4 *puVar4;
  ValueType local_12 [4];
  ValueType valueType_local;
  
  bVar2 = ValueType::IsLikelyAnyOptimizedArray(local_12);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3b4e,"(valueType.IsLikelyAnyOptimizedArray())",
                       "valueType.IsLikelyAnyOptimizedArray()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = ValueType::IsLikelyArrayOrObjectWithArray(local_12);
  if (bVar2) {
    bVar2 = ValueType::HasIntElements(local_12);
    if (bVar2) {
      return TyInt32;
    }
    bVar2 = ValueType::HasFloatElements(local_12);
    if (bVar2) {
      return TyFloat64;
    }
  }
  OVar3 = ValueType::GetObjectType(local_12);
  return IndirTypes[OVar3];
}

Assistant:

IRType Lowerer::GetArrayIndirType(const ValueType valueType)
{
    Assert(valueType.IsLikelyAnyOptimizedArray());
    if(valueType.IsLikelyArrayOrObjectWithArray())
    {
        if(valueType.HasIntElements())
        {
            return TyInt32;
        }
        else if(valueType.HasFloatElements())
        {
            return TyFloat64;
        }
    }

    return IndirTypes[static_cast<ValueType::TSize>(valueType.GetObjectType())];
}